

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildingState.cpp
# Opt level: O2

void __thiscall
BuildingState::CmdBuildRoom
          (BuildingState *this,string *input,shared_ptr<Connection> *connection,
          shared_ptr<GameData> *game_data)

{
  ostream *poVar1;
  unsigned_long __val;
  ostream *poVar2;
  element_type *extraout_RDX;
  shared_ptr<GameData> game_data_00;
  shared_ptr<Room> room;
  shared_ptr<Planet> planet;
  shared_ptr<Player> player;
  string input_string;
  stringstream ss;
  string local_270;
  __shared_ptr<Room,_(__gnu_cxx::_Lock_policy)2> local_250;
  undefined1 local_240 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228;
  __shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> local_220;
  __shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2> local_210;
  __shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> local_200;
  __shared_ptr<Room,_(__gnu_cxx::_Lock_policy)2> local_1f0;
  undefined1 local_1e0 [16];
  string local_1d0;
  undefined1 local_1b0 [392];
  
  Connection::GetPlayer((Connection *)local_1e0);
  Entity::GetPlanet((Entity *)local_240);
  std::make_shared<Room>();
  std::__shared_ptr<Room,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_1f0,&local_250);
  __val = Area::AddRoom((Area *)local_240._0_8_,(shared_ptr<Room> *)&local_1f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1f0._M_refcount);
  if ((this->super_PlayingState).super_GameState.game_data.
      super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::__cxx11::string::string((string *)(local_1e0 + 0x10),(string *)this);
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
    Tokenizer::GetFirstToken(&local_270,(string *)(local_1e0 + 0x10));
    poVar1 = (ostream *)(local_1b0 + 0x10);
    poVar2 = std::operator<<(poVar1,(string *)&local_270);
    std::operator<<(poVar2," ");
    std::__cxx11::string::~string((string *)&local_270);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar2," ");
    std::operator<<(poVar1,(string *)(local_1e0 + 0x10));
    std::__cxx11::stringbuf::str();
    std::__shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_200,(__shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> *)input);
    std::__shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_210,(__shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2> *)connection);
    game_data_00.super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)game_data;
    game_data_00.super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = extraout_RDX;
    CmdLink(&local_270,(shared_ptr<Connection> *)&local_200,game_data_00);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_210._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_200._M_refcount);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
    std::__cxx11::string::~string((string *)(local_1e0 + 0x10));
  }
  std::__cxx11::to_string((string *)local_1b0,__val);
  std::__shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_220,(__shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> *)input);
  std::__shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2> *)(local_240 + 0x10),
             (__shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2> *)connection);
  PlayingState::CmdGoto
            ((string *)local_1b0,(shared_ptr<Connection> *)&local_220,
             (shared_ptr<GameData> *)(local_240 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_228);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_220._M_refcount);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_250._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_240 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1e0 + 8));
  return;
}

Assistant:

void BuildingState::CmdBuildRoom(const std::string &input, std::shared_ptr<Connection> connection,
                                 std::shared_ptr<GameData> game_data) {
    auto player = connection->GetPlayer();
    auto planet = player->GetPlanet();
    std::shared_ptr<Room> room = std::make_shared<Room>();
    u_long room_num = planet->AddRoom(room);
    if(input.length() > 0)
    {
        std::string input_string = std::string(input);
        std::stringstream ss;
        ss << Tokenizer::GetFirstToken(input_string) << " ";
        ss << room_num << " ";
        ss << input_string;
        CmdLink(ss.str(), connection, game_data);
    }
    CmdGoto(std::to_string(room_num), connection, game_data);
}